

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O3

void Cec3_CollectSuper_rec(Gia_Obj_t *pObj,Vec_Ptr_t *vSuper,int fFirst,int fUseMuxes)

{
  size_t __size;
  int iVar1;
  Gia_Obj_t *pGVar2;
  void **ppvVar3;
  long lVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  bool bVar8;
  
  if (((ulong)pObj & 1) == 0) {
    bVar8 = fFirst == 0;
    pGVar6 = pObj;
    do {
      while( true ) {
        uVar7 = *(ulong *)pObj;
        uVar5 = (uint)uVar7;
        if (((~uVar5 & 0x9fffffff) == 0) || ((bVar8 && (1 < (int)pObj->Value)))) goto LAB_00653da2;
        if (fUseMuxes == 0) break;
        if ((uVar5 >> 0x1e & 1) != 0) goto LAB_00653da2;
        Cec3_CollectSuper_rec
                  ((Gia_Obj_t *)((ulong)(uVar5 >> 0x1d & 1) | (ulong)(pObj + -(uVar7 & 0x1fffffff)))
                   ,vSuper,0,fUseMuxes);
        pGVar2 = pObj + -(*(ulong *)pObj >> 0x20 & 0x1fffffff);
        uVar7 = (ulong)((uint)(*(ulong *)pObj >> 0x3d) & 1);
        pObj = (Gia_Obj_t *)(uVar7 | (ulong)pGVar2);
        bVar8 = true;
        if (uVar7 != 0 || ((ulong)pGVar2 & 1) != 0) goto LAB_00653da2;
      }
      fUseMuxes = 0;
      Cec3_CollectSuper_rec
                ((Gia_Obj_t *)((ulong)(uVar5 >> 0x1d & 1) | (ulong)(pGVar6 + -(uVar7 & 0x1fffffff)))
                 ,vSuper,0,0);
      pGVar2 = pGVar6 + -(*(ulong *)pGVar6 >> 0x20 & 0x1fffffff);
      uVar7 = (ulong)((uint)(*(ulong *)pGVar6 >> 0x3d) & 1);
      pObj = (Gia_Obj_t *)(uVar7 | (ulong)pGVar2);
      bVar8 = true;
      pGVar6 = pObj;
    } while (uVar7 == 0 && ((ulong)pGVar2 & 1) == 0);
  }
LAB_00653da2:
  iVar1 = vSuper->nSize;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if ((Gia_Obj_t *)vSuper->pArray[lVar4] == pObj) {
        return;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if (iVar1 == vSuper->nCap) {
    if (iVar1 < 0x10) {
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(0x80);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,0x80);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = 0x10;
    }
    else {
      __size = (ulong)(uint)(iVar1 * 2) * 8;
      if (vSuper->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc(__size);
      }
      else {
        ppvVar3 = (void **)realloc(vSuper->pArray,__size);
      }
      vSuper->pArray = ppvVar3;
      vSuper->nCap = iVar1 * 2;
    }
  }
  else {
    ppvVar3 = vSuper->pArray;
  }
  iVar1 = vSuper->nSize;
  vSuper->nSize = iVar1 + 1;
  ppvVar3[iVar1] = pObj;
  return;
}

Assistant:

void Cec3_CollectSuper_rec( Gia_Obj_t * pObj, Vec_Ptr_t * vSuper, int fFirst, int fUseMuxes )
{
    // if the new node is complemented or a PI, another gate begins
    if ( Gia_IsComplement(pObj) || Gia_ObjIsCi(pObj) || 
         (!fFirst && Gia_ObjValue(pObj) > 1) || 
         (fUseMuxes && pObj->fMark0) )
    {
        Vec_PtrPushUnique( vSuper, pObj );
        return;
    }
    // go through the branches
    Cec3_CollectSuper_rec( Gia_ObjChild0(pObj), vSuper, 0, fUseMuxes );
    Cec3_CollectSuper_rec( Gia_ObjChild1(pObj), vSuper, 0, fUseMuxes );
}